

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O1

cmStringRange __thiscall
cmState::Directory::GetIncludeDirectoriesEntries_abi_cxx11_(Directory *this)

{
  PointerType pBVar1;
  PointerType pSVar2;
  const_iterator cVar3;
  cmStringRange cVar4;
  const_iterator local_28;
  pointer local_20;
  pointer local_18;
  
  pBVar1 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                     (&this->DirectoryState);
  pSVar2 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->
                     (&(this->Snapshot_).Position);
  local_20 = (pBVar1->IncludeDirectories).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  cVar3._M_current = local_20 + pSVar2->IncludeDirectoryPosition;
  local_18 = cVar3._M_current;
  std::
  __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
            (&local_28,&local_18,&local_20,&cmPropertySentinal_abi_cxx11_);
  cVar4.End._M_current = cVar3._M_current;
  cVar4.Begin._M_current = local_28._M_current;
  return cVar4;
}

Assistant:

cmStringRange
cmState::Directory::GetIncludeDirectoriesEntries() const
{
  return GetPropertyContent(this->DirectoryState->IncludeDirectories,
                       this->Snapshot_.Position->IncludeDirectoryPosition);
}